

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.hpp
# Opt level: O3

void __thiscall manager::Manager<uttt::IBoard>::RoundRobin(Manager<uttt::IBoard> *this)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  
  for (p_Var1 = (this->bots)._M_h._M_before_begin._M_nxt;
      (p_Var1 != (_Hash_node_base *)0x0 &&
      (p_Var2 = p_Var1->_M_nxt, p_Var2 != (_Hash_node_base *)0x0)); p_Var1 = p_Var1->_M_nxt) {
    do {
      Match(this,(longlong)(p_Var1[2]._M_nxt)->_M_nxt,(longlong)(p_Var2[2]._M_nxt)->_M_nxt,2);
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void
Manager<IGame>::RoundRobin()
{
    for (auto it1 = bots.begin(); it1 != bots.end(); ++it1)
    {
        auto it2 = it1;
        ++it2;
        for (; it2 != bots.end(); ++it2)
            Match(it1->second->id, it2->second->id, 2);
    }
}